

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::verify
          (TextureGather2DCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  void *pvVar1;
  bool bVar2;
  int i;
  long lVar3;
  undefined7 extraout_var;
  Vec2 texCoords [4];
  Vector<float,_2> local_58 [4];
  Texture2DView local_38;
  long local_28;
  
  local_58[2].m_data[0] = 0.0;
  local_58[2].m_data[1] = 0.0;
  local_58[3].m_data[0] = 0.0;
  local_58[3].m_data[1] = 0.0;
  local_58[0].m_data[0] = 0.0;
  local_58[0].m_data[1] = 0.0;
  local_58[1].m_data[0] = 0.0;
  local_58[1].m_data[1] = 0.0;
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_38,this,(ulong)ctx & 0xffffffff);
  lVar3 = 0;
  pvVar1 = (void *)CONCAT44(local_38._4_4_,local_38.m_numLevels);
  do {
    *(undefined8 *)local_58[lVar3].m_data = *(undefined8 *)((long)pvVar1 + lVar3 * 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_28 - (long)pvVar1);
  }
  local_38.m_levels =
       (this->m_swizzledTexture).m_view.m_levels + (this->super_TextureGatherCase).m_baseLevel;
  local_38.m_numLevels = 1;
  bVar2 = (anonymous_namespace)::TextureGatherCase::verify<tcu::Texture2DView,tcu::Vector<float,2>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,&local_38,&local_58,
                     (this->m_iterations).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)ctx);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool TextureGather2DCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec2 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx]);
}